

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::fix_assignment_type(Generator *top)

{
  IRNode *root;
  undefined1 local_b8 [8];
  AssignmentTypeVisitor final_visitor;
  undefined1 local_58 [8];
  AssignmentTypeBlockVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  AssignmentTypeBlockVisitor::AssignmentTypeBlockVisitor((AssignmentTypeBlockVisitor *)local_58);
  IRVisitor::visit_root_tp
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  AssignmentTypeVisitor::AssignmentTypeVisitor((AssignmentTypeVisitor *)local_b8,Blocking,false);
  root = IRNode::ast_node((IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  IRVisitor::visit_root_s((IRVisitor *)local_b8,root);
  AssignmentTypeVisitor::~AssignmentTypeVisitor((AssignmentTypeVisitor *)local_b8);
  AssignmentTypeBlockVisitor::~AssignmentTypeBlockVisitor((AssignmentTypeBlockVisitor *)local_58);
  return;
}

Assistant:

void fix_assignment_type(Generator* top) {
    // first we fix all the block assignment
    AssignmentTypeBlockVisitor visitor;
    visitor.visit_root_tp(top);

    // then we assign any existing assignment as blocking assignment
    AssignmentTypeVisitor final_visitor(AssignmentType::Blocking, false);
    final_visitor.visit_root_s(top->ast_node());
}